

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall Fossilize::ZipDatabase::~ZipDatabase(ZipDatabase *this)

{
  bool bVar1;
  mz_bool mVar2;
  LogLevel LVar3;
  unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
  *local_20;
  ZipDatabase *this_local;
  
  (this->super_DatabaseInterface)._vptr_DatabaseInterface = (_func_int **)&PTR__ZipDatabase_005bd7b8
  ;
  if ((this->alive & 1U) != 0) {
    if ((((this->mode != ReadOnly) &&
         (mVar2 = mz_zip_writer_finalize_archive(&this->mz), mVar2 == 0)) &&
        (LVar3 = get_thread_log_level(), (int)LVar3 < 3)) &&
       (bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to finalize archive.\n"), !bVar1)) {
      fprintf(_stderr,"Fossilize ERROR: Failed to finalize archive.\n");
    }
    mVar2 = mz_zip_end(&this->mz);
    if (((mVar2 == 0) && (LVar3 = get_thread_log_level(), (int)LVar3 < 3)) &&
       (bVar1 = Internal::log_thread_callback(LOG_ERROR,"mz_zip_end failed!\n"), !bVar1)) {
      fprintf(_stderr,"Fossilize ERROR: mz_zip_end failed!\n");
    }
  }
  local_20 = (unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
              *)&this->mode;
  do {
    local_20 = local_20 + -1;
    std::
    unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
    ::~unordered_map(local_20);
  } while (local_20 != this->seen_blobs);
  std::__cxx11::string::~string((string *)&this->path);
  DatabaseInterface::~DatabaseInterface(&this->super_DatabaseInterface);
  return;
}

Assistant:

~ZipDatabase()
	{
		if (alive)
		{
			if (mode != DatabaseMode::ReadOnly)
			{
				if (!mz_zip_writer_finalize_archive(&mz))
					LOGE_LEVEL("Failed to finalize archive.\n");
			}

			if (!mz_zip_end(&mz))
				LOGE_LEVEL("mz_zip_end failed!\n");
		}
	}